

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strfuncs.c
# Opt level: O0

char * string_join(char *base,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_128;
  undefined8 *local_110;
  undefined1 local_f8 [8];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  char *local_40;
  char *out;
  char *c;
  size_t len;
  va_list args;
  char *base_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_f8;
  args[0]._0_8_ = &stack0x00000008;
  len._4_4_ = 0x30;
  len._0_4_ = 8;
  local_f0 = in_RSI;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  args[0].reg_save_area = base;
  c = (char *)strlen(base);
  while( true ) {
    if ((uint)len < 0x29) {
      local_110 = (undefined8 *)((long)(int)(uint)len + (long)args[0].overflow_arg_area);
      len._0_4_ = (uint)len + 8;
    }
    else {
      local_110 = (undefined8 *)args[0]._0_8_;
      args[0]._0_8_ = args[0]._0_8_ + 8;
    }
    out = (char *)*local_110;
    if (out == (char *)0x0) break;
    sVar1 = strlen(out);
    c = c + sVar1;
  }
  c = c + 1;
  local_40 = (char *)__ckd_calloc__((size_t)c,1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/strfuncs.c"
                                    ,0x55);
  args[0].overflow_arg_area = local_f8;
  args[0]._0_8_ = &stack0x00000008;
  len._4_4_ = 0x30;
  len._0_4_ = 8;
  strcpy(local_40,(char *)args[0].reg_save_area);
  while( true ) {
    if ((uint)len < 0x29) {
      local_128 = (undefined8 *)((long)(int)(uint)len + (long)args[0].overflow_arg_area);
      len._0_4_ = (uint)len + 8;
    }
    else {
      local_128 = (undefined8 *)args[0]._0_8_;
      args[0]._0_8_ = args[0]._0_8_ + 8;
    }
    out = (char *)*local_128;
    if (out == (char *)0x0) break;
    strcat(local_40,out);
  }
  return local_40;
}

Assistant:

char *
string_join(const char *base, ...)
{
    va_list args;
    size_t len;
    const char *c;
    char *out;

    va_start(args, base);
    len = strlen(base);
    while ((c = va_arg(args, const char *)) != NULL) {
        len += strlen(c);
    }
    len++;
    va_end(args);

    out = ckd_calloc(len, 1);
    va_start(args, base);
    strcpy(out, base);
    while ((c = va_arg(args, const char *)) != NULL) {
        strcat(out, c);
    }
    va_end(args);

    return out;
}